

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgt_save_glcolorbuffer_png(GLenum buffer,GLenum format,char *filename)

{
  bool bVar1;
  bool bVar2;
  djg_texture *texture;
  
  bVar2 = false;
  texture = djgt_create(0);
  bVar1 = djgt_push_glcolorbuffer(texture,buffer,format,0x1401,true);
  if (bVar1) {
    bVar2 = djgt_save_png(texture,filename);
  }
  djgt_release(texture);
  return bVar2;
}

Assistant:

bool djgt_save_bmp(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.bmp", filename);

        return stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.bmp", filename, i);

            ++i;
            if (!stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels))
                return false;
        }
    }

    return true;
}